

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void multi_deltimeout(Curl_easy *data,expire_id eid)

{
  Curl_llist_element *e;
  Curl_llist *pCVar1;
  Curl_llist *list;
  
  list = &(data->state).timeoutlist;
  pCVar1 = list;
  while( true ) {
    e = pCVar1->head;
    if (e == (Curl_llist_element *)0x0) {
      return;
    }
    if (*(expire_id *)((long)e->ptr + 0x28) == eid) break;
    pCVar1 = (Curl_llist *)&e->next;
  }
  Curl_llist_remove(list,e,(void *)0x0);
  return;
}

Assistant:

static void
multi_deltimeout(struct Curl_easy *data, expire_id eid)
{
  struct Curl_llist_element *e;
  struct Curl_llist *timeoutlist = &data->state.timeoutlist;
  /* find and remove the specific node from the list */
  for(e = timeoutlist->head; e; e = e->next) {
    struct time_node *n = (struct time_node *)e->ptr;
    if(n->eid == eid) {
      Curl_llist_remove(timeoutlist, e, NULL);
      return;
    }
  }
}